

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O0

avl_iter_t * avl_iter(avl_node_t *node)

{
  avl_iter_t *paVar1;
  uint local_24;
  avl_iter_t *result;
  size_t max;
  avl_node_t *node_local;
  
  if (node == (avl_node_t *)0x0) {
    local_24 = 1;
  }
  else {
    local_24 = node->height + 1;
  }
  paVar1 = (avl_iter_t *)malloc((ulong)local_24 * 8 + 8);
  paVar1->height = 0;
  paVar1[1].height = (size_t)node;
  return paVar1;
}

Assistant:

static inline avl_iter_t*
avl_iter(avl_node_t *node)
{
    size_t max = node ? node->height+1 : 1;
    avl_iter_t *result = (avl_iter_t*)malloc(sizeof(avl_iter_t) + sizeof(avl_node_t*) * max);
    result->height = 0;
    result->nodes[0] = node;
    return result;
}